

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::D_formatter<spdlog::details::null_scoped_padder>::format
          (D_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  long in_RDI;
  memory_buf_t *unaff_retaddr;
  int in_stack_0000000c;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffc8;
  undefined5 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 uVar1;
  null_scoped_padder in_stack_ffffffffffffffd7;
  
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,10,(padding_info *)(in_RDI + 8),in_RCX);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  uVar1 = 0x2f;
  ::fmt::v8::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffd7,
                      CONCAT16(0x2f,CONCAT15(in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd0))),
             in_stack_ffffffffffffffc8);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  ::fmt::v8::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffd7,
                      CONCAT16(uVar1,CONCAT15(0x2f,in_stack_ffffffffffffffd0))),
             in_stack_ffffffffffffffc8);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }